

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void __thiscall
clunk::Node::GetSliderDiscovers(Node *this,Color color,MoveType type,uint64_t mvs,int from)

{
  int iVar1;
  int to_00;
  int iVar2;
  int iVar3;
  bool bVar4;
  int score;
  int cap;
  int to;
  int dir;
  int end;
  int pinDir;
  int from_local;
  uint64_t mvs_local;
  MoveType type_local;
  Color color_local;
  Node *this_local;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6f9,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fa,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((undefined *)(&_board)[from] == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fb,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((uint)*(byte *)(&_board)[from] != (color | type)) {
    __assert_fail("_board[from]->type == (color|type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fc,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((uint)*(byte *)((&_board)[from] + 1) != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6fd,
                  "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  iVar1 = GetPinDir(this,color,from);
  _pinDir = mvs;
  do {
    if (_pinDir == 0) {
      return;
    }
    if ((_pinDir & 0xff) == 0) {
      __assert_fail("mvs & 0xFF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x700,
                    "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                   );
    }
    to_00 = ((uint)_pinDir & 0xff) - 1;
    iVar2 = Direction(from,to_00);
    if ((((iVar2 != -0x11 && iVar2 != -0xf) && iVar2 != 0xf) && iVar2 != 0x11) &&
        (((iVar2 != -0x10 && iVar2 != -1) && iVar2 != 1) && iVar2 != 0x10)) {
      __assert_fail("IS_DIR(dir)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x703,
                    "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                   );
    }
    if (iVar1 == 0) {
LAB_0014b007:
      score = from + iVar2;
      while( true ) {
        if ((score & 0xffffff88U) != 0) {
          __assert_fail("IS_SQUARE(to)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x706,
                        "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                       );
        }
        iVar3 = Direction(from,score);
        if (iVar3 != iVar2) {
          __assert_fail("Direction(from, to) == dir",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x707,
                        "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                       );
        }
        bVar4 = true;
        if (*(char *)(&_board)[score] == '\0') {
          bVar4 = (undefined *)(&_board)[score] == _EMPTY;
        }
        if (!bVar4) {
          __assert_fail("cap || (_board[to] == _EMPTY)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x709,
                        "void clunk::Node::GetSliderDiscovers(const Color, const MoveType, uint64_t, const int)"
                       );
        }
        if (*(char *)(&_board)[score] != '\0') break;
        if (type == BishopMove) {
          if (((_kingDir[(int)(score + (uint)((color ^ 0xffU) & 1) * 8)] != -0x11 &&
               _kingDir[(int)(score + (uint)((color ^ 0xffU) & 1) * 8)] != -0xf) &&
              _kingDir[(int)(score + (uint)((color ^ 0xffU) & 1) * 8)] != '\x0f') &&
              _kingDir[(int)(score + (uint)((color ^ 0xffU) & 1) * 8)] != '\x11') {
LAB_0014b27d:
            AddMove(this,type,from,score,
                    (*(int *)(_SQR + (long)score * 4) - *(int *)(_SQR + (long)from * 4)) + 10,0,0);
          }
        }
        else if (((_kingDir[(int)(score + (uint)((color ^ 0xffU) & 1) * 8)] != -0x10 &&
                  _kingDir[(int)(score + (uint)((color ^ 0xffU) & 1) * 8)] != -1) &&
                 _kingDir[(int)(score + (uint)((color ^ 0xffU) & 1) * 8)] != '\x01') &&
                 _kingDir[(int)(score + (uint)((color ^ 0xffU) & 1) * 8)] != '\x10')
        goto LAB_0014b27d;
        if (score == to_00) break;
        score = iVar2 + score;
      }
    }
    else {
      iVar3 = iVar2;
      if (iVar2 < 1) {
        iVar3 = -iVar2;
      }
      if (iVar3 == iVar1) goto LAB_0014b007;
    }
    _pinDir = _pinDir >> 8;
  } while( true );
}

Assistant:

void GetSliderDiscovers(const Color color, const MoveType type,
                          uint64_t mvs, const int from)
  {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|type));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    while (mvs) {
      assert(mvs & 0xFF);
      const int end = ((mvs & 0xFF) - 1);
      const int dir = (Direction(from, end));
      assert(IS_DIR(dir));
      if (!pinDir || (abs(dir) == pinDir)) {
        for (int to = (from + dir);; to += dir) {
          assert(IS_SQUARE(to));
          assert(Direction(from, to) == dir);
          const int cap = _board[to]->type;
          assert(cap || (_board[to] == _EMPTY));
          if (!cap) {
            if ((type == BishopMove) ? !IS_DIAG(_kingDir[to + (8 * !color)])
                                     : !IS_CROSS(_kingDir[to + (8 * !color)]))
            {
              const int score = (_SQR[to] - _SQR[from] + 10);
              AddMove(type, from, to, score);
            }
          }
          else {
            break;
          }
          if (to == end) {
            break;
          }
        }
      }
      mvs >>= 8;
    }
  }